

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_xinput2.c
# Opt level: O0

void queue_event(ManyMouseEvent *event)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ManyMouseEvent *event_local;
  
  lVar3 = (long)input_events_write;
  uVar1 = event->device;
  input_events[lVar3].type = event->type;
  input_events[lVar3].device = uVar1;
  iVar2 = event->value;
  input_events[lVar3].item = event->item;
  input_events[lVar3].value = iVar2;
  iVar2 = event->maxval;
  input_events[lVar3].minval = event->minval;
  input_events[lVar3].maxval = iVar2;
  input_events_write = (input_events_write + 1) % 0x400;
  if (input_events_write == input_events_read) {
    input_events_read = (input_events_read + 1) % 0x400;
  }
  return;
}

Assistant:

static void queue_event(const ManyMouseEvent *event)
{
    /* copy the event info. We'll process it in ManyMouse_PollEvent(). */
    memcpy(&input_events[input_events_write], event, sizeof (ManyMouseEvent));

    input_events_write = ((input_events_write + 1) % MAX_EVENTS);

    /* Ring buffer full? Lose oldest event. */
    if (input_events_write == input_events_read)
    {
        /* !!! FIXME: we need to not lose mouse buttons here. */
        input_events_read = ((input_events_read + 1) % MAX_EVENTS);
    } /* if */
}